

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureCubeFilteringCase::init
          (TextureCubeFilteringCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  value_type pTVar1;
  bool bVar2;
  int iVar3;
  int extraout_EAX;
  Archive *archive;
  size_type sVar4;
  TextureCube *pTVar5;
  TextureCube *pTVar6;
  TextureFormat *format;
  PixelBufferAccess *pPVar7;
  reference ppTVar8;
  reference ppTVar9;
  undefined4 extraout_var;
  Vector<float,_4> VVar10;
  value_type local_390;
  Vector<float,_2> local_2f8;
  Vector<float,_2> local_2f0;
  FilterCase local_2e8;
  Vector<float,_2> local_2d0;
  Vector<float,_2> local_2c8;
  FilterCase local_2c0;
  Vector<float,_2> local_2a8;
  Vector<float,_2> local_2a0;
  FilterCase local_298;
  Vector<float,_2> local_280;
  Vector<float,_2> local_278;
  FilterCase local_270;
  Vector<float,_2> local_258;
  Vector<float,_2> local_250;
  FilterCase local_248;
  Vector<float,_2> local_230;
  Vector<float,_2> local_228;
  FilterCase local_220;
  Vector<float,_2> local_208;
  Vector<float,_2> local_200;
  FilterCase local_1f8;
  Vector<float,_2> local_1e0;
  Vector<float,_2> local_1d8;
  FilterCase local_1d0;
  Vector<float,_2> local_1b8;
  Vector<float,_2> local_1b0;
  FilterCase local_1a8;
  value_type local_190;
  TextureCube *tex1;
  TextureCube *tex0;
  __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
  local_178;
  __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
  local_170;
  iterator i;
  Vector<float,_4> local_160;
  Vector<float,_4> local_150;
  Vec4 local_140;
  RGBA local_130;
  Vector<float,_4> local_12c;
  Vector<float,_4> local_11c;
  Vec4 local_10c;
  uint local_fc;
  uint local_f8;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  int face_1;
  Vec4 local_d4;
  Vector<float,_4> local_c4;
  Vec4 local_b4;
  int local_a4;
  CubeFace local_a0;
  int levelNdx;
  int face;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  int numLevels;
  int local_2c;
  TextureCube *pTStack_28;
  int ndx;
  TextureCubeFilteringCase *local_10;
  TextureCubeFilteringCase *this_local;
  
  local_10 = this;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_filenames);
  if (bVar2) {
    std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::reserve
              (&this->m_textures,2);
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      pTVar5 = (TextureCube *)operator_new(0x180);
      glu::TextureCube::TextureCube(pTVar5,this->m_renderCtx,this->m_internalFormat,this->m_width);
      unique0x1000103f = pTVar5;
      std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::push_back
                (&this->m_textures,(value_type *)(fmtInfo.lookupBias.m_data + 3));
    }
    iVar3 = de::max<int>(this->m_width,this->m_height);
    iVar3 = ::deLog2Floor32(iVar3);
    fmtInfo.lookupBias.m_data[2] = (float)(iVar3 + 1);
    ppTVar9 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                        (&this->m_textures,0);
    pTVar6 = glu::TextureCube::getRefTexture(*ppTVar9);
    format = tcu::TextureCube::getFormat(pTVar6);
    tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),format);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
    VVar10 = tcu::operator-((tcu *)&levelNdx,(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                            (Vector<float,_4> *)(cBias.m_data + 2));
    if ((init()::gradients == '\0') &&
       (iVar3 = __cxa_guard_acquire(VVar10.m_data._0_8_,VVar10.m_data._8_8_,&init()::gradients),
       iVar3 != 0)) {
      tcu::Vector<float,_4>::Vector(init::gradients[0],0.0,0.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[0] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1],0.5,0.0,0.0,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[1] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2],0.0,0.5,0.0,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[2] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3],0.0,0.0,0.5,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[3] + 1,1.0,1.0,1.0,0.0);
      tcu::Vector<float,_4>::Vector(init::gradients[4],0.0,0.0,0.0,0.5);
      tcu::Vector<float,_4>::Vector(init::gradients[4] + 1,1.0,1.0,1.0,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5],0.5,0.5,0.5,1.0);
      tcu::Vector<float,_4>::Vector(init::gradients[5] + 1,1.0,1.0,1.0,0.0);
      __cxa_guard_release(&init()::gradients);
    }
    for (local_a0 = CUBEFACE_NEGATIVE_X; (int)local_a0 < 6;
        local_a0 = local_a0 + CUBEFACE_POSITIVE_X) {
      for (local_a4 = 0; local_a4 < (int)fmtInfo.lookupBias.m_data[2]; local_a4 = local_a4 + 1) {
        ppTVar9 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                            (&this->m_textures,0);
        pTVar6 = glu::TextureCube::getRefTexture(*ppTVar9);
        tcu::TextureCube::allocLevel(pTVar6,local_a0,local_a4);
        ppTVar9 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                            (&this->m_textures,0);
        pTVar6 = glu::TextureCube::getRefTexture(*ppTVar9);
        pPVar7 = tcu::TextureCube::getLevelFace(pTVar6,local_a4,local_a0);
        tcu::operator*((tcu *)&local_c4,init::gradients[(int)local_a0],(Vector<float,_4> *)&levelNdx
                      );
        tcu::operator+((tcu *)&local_b4,&local_c4,(Vector<float,_4> *)(cScale.m_data + 2));
        tcu::operator*((tcu *)&levelNdx_1,init::gradients[(int)local_a0] + 1,
                       (Vector<float,_4> *)&levelNdx);
        tcu::operator+((tcu *)&local_d4,(Vector<float,_4> *)&levelNdx_1,
                       (Vector<float,_4> *)(cScale.m_data + 2));
        tcu::fillWithComponentGradients(pPVar7,&local_b4,&local_d4);
      }
    }
    for (step = 0; (int)step < 6; step = step + 1) {
      for (rgb = 0; (int)rgb < (int)fmtInfo.lookupBias.m_data[2]; rgb = rgb + 1) {
        colorA = (deUint32)(0xffffff / (long)((int)fmtInfo.lookupBias.m_data[2] * 6));
        colorB = colorA * rgb * step;
        local_f8 = colorB | 0xff000000;
        local_fc = ~colorB | 0xff000000;
        ppTVar9 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                            (&this->m_textures,1);
        pTVar6 = glu::TextureCube::getRefTexture(*ppTVar9);
        tcu::TextureCube::allocLevel(pTVar6,step,rgb);
        ppTVar9 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                            (&this->m_textures,1);
        pTVar6 = glu::TextureCube::getRefTexture(*ppTVar9);
        pPVar7 = tcu::TextureCube::getLevelFace(pTVar6,rgb,step);
        tcu::RGBA::RGBA(&local_130,local_f8);
        tcu::RGBA::toVec((RGBA *)&local_12c);
        tcu::operator*((tcu *)&local_11c,&local_12c,(Vector<float,_4> *)&levelNdx);
        tcu::operator+((tcu *)&local_10c,&local_11c,(Vector<float,_4> *)(cScale.m_data + 2));
        tcu::RGBA::RGBA((RGBA *)((long)&i._M_current + 4),local_fc);
        tcu::RGBA::toVec((RGBA *)&local_160);
        tcu::operator*((tcu *)&local_150,&local_160,(Vector<float,_4> *)&levelNdx);
        tcu::operator+((tcu *)&local_140,&local_150,(Vector<float,_4> *)(cScale.m_data + 2));
        tcu::fillWithGrid(pPVar7,4,&local_10c,&local_140);
      }
    }
    local_170._M_current =
         (TextureCube **)
         std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::begin
                   (&this->m_textures);
    while( true ) {
      local_178._M_current =
           (TextureCube **)
           std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::end
                     (&this->m_textures);
      bVar2 = __gnu_cxx::operator!=(&local_170,&local_178);
      if (!bVar2) break;
      ppTVar8 = __gnu_cxx::
                __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
                ::operator*(&local_170);
      glu::TextureCube::upload(*ppTVar8);
      tex0 = (TextureCube *)
             __gnu_cxx::
             __normal_iterator<glu::TextureCube_**,_std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>_>
             ::operator++(&local_170,0);
    }
  }
  else {
    std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::reserve
              (&this->m_textures,1);
    context = this->m_renderCtx;
    contextInfo = this->m_renderCtxInfo;
    archive = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_filenames);
    pTStack_28 = glu::TextureCube::create
                           (context,contextInfo,archive,(int)sVar4 / 6,&this->m_filenames);
    std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::push_back
              (&this->m_textures,&stack0xffffffffffffffd8);
  }
  ppTVar9 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                      (&this->m_textures,0);
  tex1 = *ppTVar9;
  sVar4 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::size
                    (&this->m_textures);
  if (sVar4 < 2) {
    local_390 = tex1;
  }
  else {
    ppTVar9 = std::vector<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>::operator[]
                        (&this->m_textures,1);
    local_390 = *ppTVar9;
  }
  pTVar5 = tex1;
  local_190 = local_390;
  if ((this->m_onlySampleFaceInterior & 1U) == 0) {
    iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar3 = tcu::RenderTarget::getNumSamples((RenderTarget *)CONCAT44(extraout_var,iVar3));
    pTVar5 = tex1;
    if (iVar3 == 0) {
      tcu::Vector<float,_2>::Vector(&local_250,-1.25,-1.2);
      tcu::Vector<float,_2>::Vector(&local_258,1.2,1.25);
      FilterCase::FilterCase(&local_248,pTVar5,&local_250,&local_258);
      std::
      vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
      ::push_back(&this->m_cases,&local_248);
    }
    else {
      tcu::Vector<float,_2>::Vector(&local_278,-1.19,-1.3);
      tcu::Vector<float,_2>::Vector(&local_280,1.1,1.35);
      FilterCase::FilterCase(&local_270,pTVar5,&local_278,&local_280);
      std::
      vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
      ::push_back(&this->m_cases,&local_270);
    }
    pTVar5 = tex1;
    tcu::Vector<float,_2>::Vector(&local_2a0,0.8,0.8);
    tcu::Vector<float,_2>::Vector(&local_2a8,1.25,1.2);
    FilterCase::FilterCase(&local_298,pTVar5,&local_2a0,&local_2a8);
    std::
    vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_298);
    pTVar1 = local_190;
    tcu::Vector<float,_2>::Vector(&local_2c8,-1.19,-1.3);
    tcu::Vector<float,_2>::Vector(&local_2d0,1.1,1.35);
    FilterCase::FilterCase(&local_2c0,pTVar1,&local_2c8,&local_2d0);
    std::
    vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_2c0);
    pTVar1 = local_190;
    tcu::Vector<float,_2>::Vector(&local_2f0,-1.2,-1.1);
    tcu::Vector<float,_2>::Vector(&local_2f8,-0.8,-0.8);
    FilterCase::FilterCase(&local_2e8,pTVar1,&local_2f0,&local_2f8);
    std::
    vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_2e8);
  }
  else {
    tcu::Vector<float,_2>::Vector(&local_1b0,-0.8,-0.8);
    tcu::Vector<float,_2>::Vector(&local_1b8,0.8,0.8);
    FilterCase::FilterCase(&local_1a8,pTVar5,&local_1b0,&local_1b8);
    std::
    vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_1a8);
    pTVar5 = tex1;
    tcu::Vector<float,_2>::Vector(&local_1d8,0.5,0.65);
    tcu::Vector<float,_2>::Vector(&local_1e0,0.8,0.8);
    FilterCase::FilterCase(&local_1d0,pTVar5,&local_1d8,&local_1e0);
    std::
    vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_1d0);
    pTVar1 = local_190;
    tcu::Vector<float,_2>::Vector(&local_200,-0.8,-0.8);
    tcu::Vector<float,_2>::Vector(&local_208,0.8,0.8);
    FilterCase::FilterCase(&local_1f8,pTVar1,&local_200,&local_208);
    std::
    vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_1f8);
    pTVar1 = local_190;
    tcu::Vector<float,_2>::Vector(&local_228,0.2,0.2);
    tcu::Vector<float,_2>::Vector(&local_230,0.6,0.5);
    FilterCase::FilterCase(&local_220,pTVar1,&local_228,&local_230);
    std::
    vector<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeFilteringCase::FilterCase>_>
    ::push_back(&this->m_cases,&local_220);
  }
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeFilteringCase::init (void)
{
	try
	{
		if (!m_filenames.empty())
		{
			m_textures.reserve(1);
			m_textures.push_back(glu::TextureCube::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size() / 6, m_filenames));
		}
		else
		{
			DE_ASSERT(m_width == m_height);
			m_textures.reserve(2);
			for (int ndx = 0; ndx < 2; ndx++)
				m_textures.push_back(new glu::TextureCube(m_renderCtx, m_internalFormat, m_width));

			const int				numLevels	= deLog2Floor32(de::max(m_width, m_height))+1;
			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
			tcu::Vec4				cBias		= fmtInfo.valueMin;
			tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill first with gradient texture.
			static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
			{
				{ tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
				{ tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
				{ tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
				{ tcu::Vec4(0.0f, 0.0f, 0.5f, 1.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
				{ tcu::Vec4(0.0f, 0.0f, 0.0f, 0.5f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
				{ tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
			};
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			{
				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					m_textures[0]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
					tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
				}
			}

			// Fill second with grid texture.
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			{
				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					deUint32	step	= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
					deUint32	rgb		= step*levelNdx*face;
					deUint32	colorA	= 0xff000000 | rgb;
					deUint32	colorB	= 0xff000000 | ~rgb;

					m_textures[1]->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
					tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}

			// Upload.
			for (std::vector<glu::TextureCube*>::iterator i = m_textures.begin(); i != m_textures.end(); i++)
				(*i)->upload();
		}

		// Compute cases
		{
			const glu::TextureCube*	tex0	= m_textures[0];
			const glu::TextureCube* tex1	= m_textures.size() > 1 ? m_textures[1] : tex0;

			if (m_onlySampleFaceInterior)
			{
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(-0.8f, -0.8f), tcu::Vec2(0.8f,  0.8f)));	// minification
				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.5f, 0.65f), tcu::Vec2(0.8f,  0.8f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-0.8f, -0.8f), tcu::Vec2(0.8f,  0.8f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(0.2f, 0.2f), tcu::Vec2(0.6f,  0.5f)));		// magnification
			}
			else
			{
				if (m_renderCtx.getRenderTarget().getNumSamples() == 0)
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f)));	// minification
				else
					m_cases.push_back(FilterCase(tex0, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification - w/ tweak to avoid hitting triangle edges with face switchpoint

				m_cases.push_back(FilterCase(tex0, tcu::Vec2(0.8f, 0.8f), tcu::Vec2(1.25f, 1.20f)));	// magnification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification
				m_cases.push_back(FilterCase(tex1, tcu::Vec2(-1.2f, -1.1f), tcu::Vec2(-0.8f, -0.8f)));	// magnification
			}
		}

		m_caseNdx = 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Clean up to save memory.
		TextureCubeFilteringCase::deinit();
		throw;
	}
}